

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall CVmObjDict::save_to_file(CVmObjDict *this,CVmFile *fp)

{
  long seekpos;
  long seekpos_00;
  CVmFile *local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  CVmFile::write_uint4(fp,*(uint *)((this->super_CVmObject).ext_ + 0x20));
  seekpos = CVmFile::get_pos(fp);
  CVmFile::write_uint4(fp,0);
  local_30 = 0;
  uStack_28 = 0;
  local_38 = fp;
  CVmHashTable::enum_entries
            (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),save_file_cb,&local_38);
  seekpos_00 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,seekpos);
  CVmFile::write_uint4(fp,(uint)local_30);
  CVmFile::set_pos(fp,seekpos_00);
  return;
}

Assistant:

void CVmObjDict::save_to_file(VMG_ CVmFile *fp)
{
    long cnt_pos;
    long end_pos;
    save_file_ctx ctx;

    /* write the current comparator object */
    fp->write_uint4(get_ext()->comparator_);
    
    /* remember the starting seek position and write a placeholder count */
    cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate the entries to write out each one */
    ctx.fp = fp;
    ctx.cnt = 0;
    ctx.vmg = VMGLOB_ADDR;
    get_ext()->hashtab_->enum_entries(&save_file_cb, &ctx);

    /* remember our position for a moment */
    end_pos = fp->get_pos();

    /* go back and write out the symbol count prefix */
    fp->set_pos(cnt_pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to the end */
    fp->set_pos(end_pos);
}